

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,_testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  string *psVar3;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *pCVar10;
  long *plVar11;
  undefined8 *puVar12;
  size_t sVar13;
  TestFactoryBase *pTVar14;
  char *pcVar15;
  _Alloc_hider _Var16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong *puVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  ulong uVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  char *pcVar21;
  type_info *ptVar22;
  CodeLocation *pCVar23;
  undefined1 *puVar24;
  size_type __dnew;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_398;
  pointer local_390;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  int local_378;
  CodeLocation local_370;
  string local_348;
  GTestLog local_324;
  string local_320;
  int local_300;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  pointer local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  uint local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b0;
  pointer local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  int local_290;
  string local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  pointer local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  uint local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  pointer local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  allocator<char> local_220;
  allocator<char> local_21f;
  allocator<char> local_21e;
  allocator<char> local_21d;
  allocator<char> local_21c;
  allocator<char> local_21b;
  allocator<char> local_21a;
  allocator<char> local_219;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  pointer local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  int local_1f8;
  TypedTestSuitePState *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  CodeLocation *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  pointer local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  int local_1a0;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  pointer local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  uint local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_150;
  long local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_130;
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  size_type local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  CodeLocation *local_f0;
  size_type local_e8;
  undefined1 local_e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  key_type local_b0;
  key_type local_90;
  undefined1 local_70 [17];
  undefined7 uStack_5f;
  undefined8 uStack_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_1f0 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest08CertificatePolicies");
  pcVar8 = strchr((char *)code_location,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,(char *)code_location,&local_220);
  }
  else {
    local_150 = &local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,code_location,pcVar8);
  }
  local_e0._16_8_ = local_150;
  if (local_148 != 0) {
    pcVar8 = local_150->_M_local_buf + local_148;
    do {
      paVar20 = local_150;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_e0._16_8_ = paVar20;
      if (iVar7 == 0) break;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(pcVar8 + -1);
      uVar18 = (long)paVar19 - (long)paVar20;
      std::__cxx11::string::_M_erase((ulong)&local_150,uVar18);
      pcVar8 = local_150->_M_local_buf + uVar18;
      local_e0._16_8_ = local_150;
    } while (paVar19 != paVar20);
  }
  local_150 = &local_140;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._16_8_ == local_150) {
    local_c0._8_8_ = local_140._8_8_;
    local_e0._16_8_ = &local_c0;
  }
  local_c0._M_allocated_capacity._1_7_ = local_140._M_allocated_capacity._1_7_;
  local_c0._M_local_buf[0] = local_140._M_local_buf[0];
  local_e0._24_8_ = local_148;
  local_148 = 0;
  local_140._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                  *)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 8),
                 (key_type *)(local_e0 + 0x10));
  iVar7 = 0x6f40f0;
  if (cVar9._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 0x10)) {
    FormatFileLocation_abi_cxx11_
              (&local_370.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6f40f0
              );
    TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
LAB_003fbd20:
    FormatFileLocation_abi_cxx11_
              (&local_370.file,(internal *)local_178->_M_local_buf,(char *)(ulong)local_158,iVar7);
    TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
    ::Register();
  }
  else {
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_,
                         (string *)(local_e0 + 0x10));
    local_1c0 = &local_1b0;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c0,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_1a0 = pCVar10->line;
    local_218 = &local_208;
    local_370.file._M_dataplus._M_p = (pointer)0x16;
    local_218 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_218,(ulong)&local_370);
    local_208._M_allocated_capacity = (size_type)local_370.file._M_dataplus._M_p;
    local_218->_M_allocated_capacity = 0x6543796669726556;
    (&local_218->_M_allocated_capacity)[1] = 0x7461636966697472;
    *(char *)((long)local_218 + 0xe) = 'a';
    *(char *)((long)local_218 + 0xf) = 't';
    *(char *)((long)local_218 + 0x10) = 'e';
    *(char *)((long)local_218 + 0x11) = 'C';
    *(char *)((long)local_218 + 0x12) = 'h';
    *(char *)((long)local_218 + 0x13) = 'a';
    *(char *)((long)local_218 + 0x14) = 'i';
    *(char *)((long)local_218 + 0x15) = 'n';
    local_210 = local_370.file._M_dataplus._M_p;
    local_218->_M_local_buf[(long)local_370.file._M_dataplus._M_p] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_2d8 = &local_2c8;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar20) {
      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2c8._8_8_ = plVar11[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2d0 = (pointer)plVar11[1];
    *plVar11 = (long)paVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
    local_2b0 = &local_2a0;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar20) {
      local_2a0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2a0._8_8_ = puVar12[3];
    }
    else {
      local_2a0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12;
    }
    local_2a8 = (pointer)puVar12[1];
    *puVar12 = paVar20;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_398 = &local_388;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar20) {
      local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_388._8_8_ = plVar11[3];
    }
    else {
      local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_390 = (pointer)plVar11[1];
    *plVar11 = (long)paVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_398,**(ulong **)local_1f0);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_320.field_2._M_allocated_capacity = *puVar17;
      local_320.field_2._8_8_ = plVar11[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar17;
      local_320._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_320._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar8 = strchr((char *)code_location,0x2c);
    if (pcVar8 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_348,(char *)code_location,&local_21f);
    }
    else {
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,code_location,pcVar8);
    }
    local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_348._M_dataplus._M_p;
    if ((pointer)local_348._M_string_length != (pointer)0x0) {
      pcVar8 = (char *)(local_348._M_string_length + (long)local_348._M_dataplus._M_p);
      do {
        _Var16._M_p = local_348._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar8[-1]);
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var16._M_p;
        if (iVar7 == 0) break;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar8 + -1);
        uVar18 = (long)paVar20 - (long)_Var16._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_348,uVar18);
        pcVar8 = local_348._M_dataplus._M_p + uVar18;
        local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_348._M_dataplus._M_p;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var16._M_p);
    }
    local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    if (local_268 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p) {
      local_258._8_8_ = local_348.field_2._8_8_;
      local_268 = &local_258;
    }
    paVar20 = local_268;
    local_258._M_allocated_capacity = local_348.field_2._M_allocated_capacity;
    local_260 = (pointer)local_348._M_string_length;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity =
         local_348.field_2._M_allocated_capacity & 0xffffffffffffff00;
    GetTypeName_abi_cxx11_
              (&local_2f8,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               (type_info *)local_348._M_dataplus._M_p);
    _Var16._M_p = local_2f8._M_dataplus._M_p;
    local_370.file._M_dataplus._M_p = (pointer)&local_370.file.field_2;
    local_1c8 = code_location;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_1c0,local_1b8 + (long)local_1c0);
    iVar7 = local_1a0;
    paVar19 = local_1c0;
    local_370.line = local_1a0;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar19->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_288);
    }
    iVar7 = local_1a0;
    paVar19 = local_1c0;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_288,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar19 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar19->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar19->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_288);
    }
    pTVar14 = (TestFactoryBase *)operator_new(8);
    pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dcc80;
    MakeAndRegisterTestInfo
              (&local_320,paVar20->_M_local_buf,_Var16._M_p,(char *)0x0,&local_370,
               &TypeIdHelper<bssl::PkitsTest08CertificatePolicies<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.file._M_dataplus._M_p != &local_370.file.field_2) {
      operator_delete(local_370.file._M_dataplus._M_p,
                      local_370.file.field_2._M_allocated_capacity + 1);
    }
    pCVar10 = local_1c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,
                      (ulong)(local_348.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388._M_allocated_capacity + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208._M_allocated_capacity + 1);
    }
    if (local_1c0 == &local_1b0) {
      local_388._8_8_ = local_1b0._8_8_;
      local_398 = &local_388;
    }
    else {
      local_398 = local_1c0;
    }
    local_388._M_allocated_capacity._1_7_ = local_1b0._M_allocated_capacity._1_7_;
    local_388._M_local_buf[0] = local_1b0._M_local_buf[0];
    local_390 = local_1b8;
    local_1b8 = (pointer)0x0;
    local_1b0._M_local_buf[0] = '\0';
    local_378 = local_1a0;
    local_1c0 = &local_1b0;
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388._M_allocated_capacity + 1);
    }
    if (local_1c0 != &local_1b0) {
      operator_delete(local_1c0,
                      CONCAT71(local_1b0._M_allocated_capacity._1_7_,local_1b0._M_local_buf[0]) + 1)
      ;
    }
    local_178 = &local_168;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(prefix + 0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)prefix == paVar20) {
      local_168._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_168._8_8_ = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_168._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_178 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)prefix;
    }
    local_170 = *(pointer *)(prefix + 8);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)prefix = paVar20;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_158 = *(uint *)(prefix + 0x20);
    pcVar8 = strchr((char *)pCVar10,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest08CertificatePolicies");
    pcVar15 = strchr(pcVar8,0x2c);
    if (pcVar15 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,pcVar8,&local_21e);
    }
    else {
      local_130 = &local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,pcVar8,pcVar15);
    }
    local_b0._M_dataplus._M_p = (pointer)local_130;
    if (local_128 != 0) {
      pcVar15 = local_130->_M_local_buf + local_128;
      do {
        paVar20 = local_130;
        iVar7 = isspace((uint)(byte)pcVar15[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar20;
        if (iVar7 == 0) break;
        pcVar21 = pcVar15 + -1;
        uVar18 = (long)pcVar21 - (long)paVar20;
        std::__cxx11::string::_M_erase((ulong)&local_130,uVar18);
        pcVar15 = local_130->_M_local_buf + uVar18;
        local_b0._M_dataplus._M_p = (pointer)local_130;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar20);
    }
    local_130 = &local_120;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_130) {
      local_b0.field_2._8_8_ = local_120._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_120._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_120._M_local_buf[0];
    local_b0._M_string_length = local_128;
    local_128 = 0;
    local_120._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 8),
                   &local_b0);
    iVar7 = 0x6f40f0;
    if (cVar9._M_node ==
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 0x10))
    goto LAB_003fbd20;
    pCVar10 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_,
                         &local_b0);
    local_218 = &local_208;
    pcVar2 = (pCVar10->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
    local_1f8 = pCVar10->line;
    local_268 = &local_258;
    local_370.file._M_dataplus._M_p = (pointer)0x16;
    local_268 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)&local_268,(ulong)&local_370);
    local_258._M_allocated_capacity = (size_type)local_370.file._M_dataplus._M_p;
    local_268->_M_allocated_capacity = 0x6543796669726556;
    *(char *)((long)local_268 + 8) = 'r';
    *(char *)((long)local_268 + 9) = 't';
    *(char *)((long)local_268 + 10) = 'i';
    *(char *)((long)local_268 + 0xb) = 'f';
    *(char *)((long)local_268 + 0xc) = 'i';
    *(char *)((long)local_268 + 0xd) = 'c';
    *(char *)((long)local_268 + 0xe) = 'a';
    *(char *)((long)local_268 + 0xf) = 't';
    *(char *)((long)local_268 + 0xe) = 'a';
    *(char *)((long)local_268 + 0xf) = 't';
    *(char *)((long)local_268 + 0x10) = 'e';
    *(char *)((long)local_268 + 0x11) = 'C';
    *(char *)((long)local_268 + 0x12) = 'h';
    *(char *)((long)local_268 + 0x13) = 'a';
    *(char *)((long)local_268 + 0x14) = 'i';
    *(char *)((long)local_268 + 0x15) = 'n';
    local_260 = local_370.file._M_dataplus._M_p;
    local_268->_M_local_buf[(long)local_370.file._M_dataplus._M_p] = '\0';
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_268);
    local_2d8 = &local_2c8;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar20) {
      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2c8._8_8_ = plVar11[3];
    }
    else {
      local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_2d0 = (pointer)plVar11[1];
    *plVar11 = (long)paVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d8);
    local_2b0 = &local_2a0;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar12 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar12 == paVar20) {
      local_2a0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2a0._8_8_ = puVar12[3];
    }
    else {
      local_2a0._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_2b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12;
    }
    local_2a8 = (pointer)puVar12[1];
    *puVar12 = paVar20;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_2b0);
    local_398 = &local_388;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 == paVar20) {
      local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_388._8_8_ = plVar11[3];
    }
    else {
      local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11;
    }
    local_390 = (pointer)plVar11[1];
    *plVar11 = (long)paVar20;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_398,**(ulong **)local_1f0);
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    puVar17 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_320.field_2._M_allocated_capacity = *puVar17;
      local_320.field_2._8_8_ = plVar11[3];
    }
    else {
      local_320.field_2._M_allocated_capacity = *puVar17;
      local_320._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_320._M_string_length = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    pcVar15 = strchr(pcVar8,0x2c);
    if (pcVar15 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,pcVar8,&local_21d);
    }
    else {
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,pcVar8,pcVar15);
    }
    _Var16._M_p = local_2f8._M_dataplus._M_p;
    if ((pointer)local_2f8._M_string_length != (pointer)0x0) {
      pcVar15 = (char *)(local_2f8._M_string_length + (long)local_2f8._M_dataplus._M_p);
      do {
        _Var5._M_p = local_2f8._M_dataplus._M_p;
        iVar7 = isspace((uint)(byte)pcVar15[-1]);
        _Var16._M_p = _Var5._M_p;
        if (iVar7 == 0) break;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar15 + -1);
        uVar18 = (long)paVar20 - (long)_Var5._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_2f8,uVar18);
        pcVar15 = local_2f8._M_dataplus._M_p + uVar18;
        _Var16._M_p = local_2f8._M_dataplus._M_p;
      } while (paVar20 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var5._M_p);
    }
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    local_348._M_dataplus._M_p = _Var16._M_p;
    if (_Var16._M_p == local_2f8._M_dataplus._M_p) {
      local_348.field_2._8_8_ = local_2f8.field_2._8_8_;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
    }
    _Var16._M_p = local_348._M_dataplus._M_p;
    local_348.field_2._M_allocated_capacity = local_2f8.field_2._M_allocated_capacity;
    local_348._M_string_length = local_2f8._M_string_length;
    local_2f8._M_string_length = 0;
    local_2f8.field_2._M_allocated_capacity =
         local_2f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    GetTypeName_abi_cxx11_
              (&local_288,
               (internal *)
               &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
               (type_info *)local_2f8._M_dataplus._M_p);
    _Var5._M_p = local_288._M_dataplus._M_p;
    local_370.file._M_dataplus._M_p = (pointer)&local_370.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_370,local_218,local_210 + (long)local_218);
    iVar7 = local_1f8;
    paVar20 = local_218;
    local_370.line = local_1f8;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_240,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar20->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar20->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_240);
    }
    iVar7 = local_1f8;
    paVar20 = local_218;
    bVar6 = IsTrue(true);
    if (!bVar6) {
      GTestLog::GTestLog((GTestLog *)&local_240,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar20 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar13 = strlen(paVar20->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar20->_M_local_buf,sVar13);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar7);
      GTestLog::~GTestLog((GTestLog *)&local_240);
    }
    pTVar14 = (TestFactoryBase *)operator_new(8);
    pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dcd18;
    MakeAndRegisterTestInfo
              (&local_320,_Var16._M_p,_Var5._M_p,(char *)0x0,&local_370,
               &TypeIdHelper<bssl::PkitsTest08CertificatePolicies<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370.file._M_dataplus._M_p != &local_370.file.field_2) {
      operator_delete(local_370.file._M_dataplus._M_p,
                      local_370.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != &local_348.field_2) {
      operator_delete(local_348._M_dataplus._M_p,
                      (ulong)(local_348.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,
                      (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if (local_398 != &local_388) {
      operator_delete(local_398,local_388._M_allocated_capacity + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,(ulong)(local_258._M_allocated_capacity + 1));
    }
    uVar4 = local_208._M_allocated_capacity;
    if (local_218 == &local_208) {
      local_388._8_8_ = local_208._8_8_;
      local_398 = &local_388;
    }
    else {
      local_398 = local_218;
    }
    local_388._M_allocated_capacity = local_208._M_allocated_capacity;
    local_390 = local_210;
    local_210 = (pointer)0x0;
    local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
    local_378 = local_1f8;
    local_218 = &local_208;
    if (local_398 != &local_388) {
      operator_delete(local_398,uVar4 + 1);
    }
    if (local_218 != &local_208) {
      operator_delete(local_218,local_208._M_allocated_capacity + 1);
    }
    local_268 = &local_258;
    if (local_178 == &local_168) {
      local_258._8_8_ = local_168._8_8_;
    }
    else {
      local_268 = local_178;
    }
    local_258._M_allocated_capacity = local_168._M_allocated_capacity;
    local_260 = local_170;
    local_170 = (pointer)0x0;
    local_168._M_allocated_capacity = local_168._M_allocated_capacity & 0xffffffffffffff00;
    local_248 = local_158;
    local_178 = &local_168;
    pcVar8 = strchr(pcVar8,0x2c);
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar8 + 1);
        pcVar8 = pcVar8 + 1;
        iVar7 = isspace((uint)*pbVar1);
      } while (iVar7 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest08CertificatePolicies");
    pcVar15 = strchr(pcVar8,0x2c);
    if (pcVar15 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,pcVar8,&local_21c);
    }
    else {
      local_110 = &local_100;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,pcVar8,pcVar15);
    }
    local_90._M_dataplus._M_p = (pointer)local_110;
    if (local_108 != 0) {
      pcVar15 = local_110->_M_local_buf + local_108;
      do {
        paVar20 = local_110;
        iVar7 = isspace((uint)(byte)pcVar15[-1]);
        local_90._M_dataplus._M_p = (pointer)paVar20;
        if (iVar7 == 0) break;
        pcVar21 = pcVar15 + -1;
        uVar18 = (long)pcVar21 - (long)paVar20;
        std::__cxx11::string::_M_erase((ulong)&local_110,uVar18);
        pcVar15 = local_110->_M_local_buf + uVar18;
        local_90._M_dataplus._M_p = (pointer)local_110;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar20);
    }
    local_110 = &local_100;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == local_110) {
      local_90.field_2._8_8_ = local_100._8_8_;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    local_90.field_2._M_allocated_capacity._1_7_ = local_100._M_allocated_capacity._1_7_;
    local_90.field_2._M_local_buf[0] = local_100._M_local_buf[0];
    local_90._M_string_length = local_108;
    local_108 = 0;
    local_100._M_local_buf[0] = '\0';
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                    *)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 8),
                   &local_90);
    iVar7 = 0x6f40f0;
    if (cVar9._M_node !=
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 0x10)) {
      pCVar10 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_,
                           &local_90);
      local_2b0 = &local_2a0;
      pcVar2 = (pCVar10->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b0,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
      local_290 = pCVar10->line;
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      local_370.file._M_dataplus._M_p = (pointer)0x16;
      local_2f8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_370);
      local_2f8.field_2._M_allocated_capacity = (size_type)local_370.file._M_dataplus._M_p;
      *(undefined8 *)local_2f8._M_dataplus._M_p = 0x6543796669726556;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 8) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 9) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 10) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xb) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xc) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xd) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xf) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xe) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0xf) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x10) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x11) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x12) = 'h';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x13) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x14) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p + 0x15) = 'n';
      local_2f8._M_string_length = (size_type)local_370.file._M_dataplus._M_p;
      local_2f8._M_dataplus._M_p[(long)local_370.file._M_dataplus._M_p] = '\0';
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar20) {
        local_348.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_348.field_2._8_8_ = plVar11[3];
      }
      else {
        local_348.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_348._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_348._M_string_length = plVar11[1];
      *plVar11 = (long)paVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_348);
      local_2d8 = &local_2c8;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar20) {
        local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_2c8._8_8_ = plVar11[3];
      }
      else {
        local_2c8._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_2d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_2d0 = (pointer)plVar11[1];
      *plVar11 = (long)paVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_398 = &local_388;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 == paVar20) {
        local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_388._8_8_ = plVar11[3];
      }
      else {
        local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11;
      }
      local_390 = (pointer)plVar11[1];
      *plVar11 = (long)paVar20;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_398,**(ulong **)local_1f0);
      local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
      puVar17 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_320.field_2._M_allocated_capacity = *puVar17;
        local_320.field_2._8_8_ = plVar11[3];
      }
      else {
        local_320.field_2._M_allocated_capacity = *puVar17;
        local_320._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_320._M_string_length = plVar11[1];
      *plVar11 = (long)puVar17;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      pcVar15 = strchr(pcVar8,0x2c);
      if (pcVar15 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,pcVar8,&local_21b);
      }
      else {
        local_240 = &local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,pcVar8,pcVar15);
      }
      local_288._M_dataplus._M_p = (pointer)local_240;
      if (local_238 != (pointer)0x0) {
        ptVar22 = (type_info *)(local_240->_M_local_buf + (long)local_238);
        do {
          paVar20 = local_240;
          iVar7 = isspace((uint)(byte)ptVar22[-1]);
          local_288._M_dataplus._M_p = (pointer)paVar20;
          if (iVar7 == 0) break;
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar22 + -1);
          uVar18 = (long)paVar19 - (long)paVar20;
          std::__cxx11::string::_M_erase((ulong)&local_240,uVar18);
          ptVar22 = (type_info *)(local_240->_M_local_buf + uVar18);
          local_288._M_dataplus._M_p = (pointer)local_240;
        } while (paVar19 != paVar20);
      }
      local_240 = &local_230;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p == local_240) {
        local_288.field_2._8_8_ = local_230._8_8_;
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      }
      _Var16._M_p = local_288._M_dataplus._M_p;
      local_288.field_2._M_allocated_capacity = local_230._M_allocated_capacity;
      local_288._M_string_length = (size_type)local_238;
      local_238 = (pointer)0x0;
      local_230._M_allocated_capacity = local_230._M_allocated_capacity & 0xffffffffffffff00;
      GetTypeName_abi_cxx11_
                (&local_198,
                 (internal *)
                 &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                 (type_info *)local_240->_M_local_buf);
      _Var5._M_p = local_198._M_dataplus._M_p;
      local_370.file._M_dataplus._M_p = (pointer)&local_370.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_370,local_2b0,local_2a8 + (long)local_2b0);
      iVar7 = local_290;
      paVar20 = local_2b0;
      local_370.line = local_290;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_1e8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar20 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar13 = strlen(paVar20->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar20->_M_local_buf,sVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_1e8);
      }
      iVar7 = local_290;
      paVar20 = local_2b0;
      bVar6 = IsTrue(true);
      if (!bVar6) {
        GTestLog::GTestLog((GTestLog *)&local_1e8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar20 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar13 = strlen(paVar20->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar20->_M_local_buf,sVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar7);
        GTestLog::~GTestLog((GTestLog *)&local_1e8);
      }
      pTVar14 = (TestFactoryBase *)operator_new(8);
      pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dcdb0;
      MakeAndRegisterTestInfo
                (&local_320,_Var16._M_p,_Var5._M_p,(char *)0x0,&local_370,
                 &TypeIdHelper<bssl::PkitsTest08CertificatePolicies<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370.file._M_dataplus._M_p != &local_370.file.field_2) {
        operator_delete(local_370.file._M_dataplus._M_p,
                        local_370.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if (local_398 != &local_388) {
        operator_delete(local_398,local_388._M_allocated_capacity + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,
                        (ulong)(local_348.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        (ulong)(local_2f8.field_2._M_allocated_capacity + 1));
      }
      uVar4 = local_2a0._M_allocated_capacity;
      if (local_2b0 == &local_2a0) {
        local_388._8_8_ = local_2a0._8_8_;
        local_398 = &local_388;
      }
      else {
        local_398 = local_2b0;
      }
      local_388._M_allocated_capacity = local_2a0._M_allocated_capacity;
      local_390 = local_2a8;
      local_2a8 = (pointer)0x0;
      local_2a0._M_allocated_capacity = local_2a0._M_allocated_capacity & 0xffffffffffffff00;
      local_378 = local_290;
      local_2b0 = &local_2a0;
      if (local_398 != &local_388) {
        operator_delete(local_398,uVar4 + 1);
      }
      if (local_2b0 != &local_2a0) {
        operator_delete(local_2b0,local_2a0._M_allocated_capacity + 1);
      }
      local_2d8 = &local_2c8;
      if (local_268 == &local_258) {
        local_2c8._8_8_ = local_258._8_8_;
      }
      else {
        local_2d8 = local_268;
      }
      local_2c8._M_allocated_capacity = local_258._M_allocated_capacity;
      local_2d0 = local_260;
      local_260 = (pointer)0x0;
      local_258._M_allocated_capacity = local_258._M_allocated_capacity & 0xffffffffffffff00;
      local_2b8 = local_248;
      local_268 = &local_258;
      pcVar8 = strchr(pcVar8,0x2c);
      if (pcVar8 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar8 + 1);
          pcVar8 = pcVar8 + 1;
          iVar7 = isspace((uint)*pbVar1);
        } while (iVar7 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest08CertificatePolicies");
      pcVar15 = strchr(pcVar8,0x2c);
      if (pcVar15 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,pcVar8,&local_21a);
      }
      else {
        local_f0 = (CodeLocation *)local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,pcVar8,pcVar15);
      }
      local_70._0_8_ = local_f0;
      if (local_e8 != 0) {
        puVar24 = (undefined1 *)((long)&(local_f0->file)._M_dataplus._M_p + local_e8);
        do {
          pCVar10 = local_f0;
          iVar7 = isspace((uint)(byte)puVar24[-1]);
          local_70._0_8_ = pCVar10;
          if (iVar7 == 0) break;
          pCVar23 = (CodeLocation *)(puVar24 + -1);
          uVar18 = (long)pCVar23 - (long)pCVar10;
          std::__cxx11::string::_M_erase((ulong)&local_f0,uVar18);
          puVar24 = (undefined1 *)(uVar18 + (long)local_f0);
          local_70._0_8_ = local_f0;
        } while (pCVar23 != pCVar10);
      }
      local_1c8 = (CodeLocation *)(local_70 + 0x10);
      local_f0 = (CodeLocation *)local_e0;
      if ((CodeLocation *)local_70._0_8_ == local_f0) {
        uStack_58 = local_e0._8_8_;
        local_70._0_8_ = local_1c8;
      }
      uStack_5f = local_e0._1_7_;
      local_70[0x10] = local_e0[0];
      local_70._8_8_ = local_e8;
      local_e8 = 0;
      local_e0[0] = 0;
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                      *)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 8),
                     (key_type *)local_70);
      iVar7 = 0x6f40f0;
      if (cVar9._M_node !=
          (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_ + 0x10))
      {
        pCVar10 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::gtest_typed_test_suite_p_state_PkitsTest08CertificatePolicies_,
                             (string *)local_70);
        local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
        pcVar2 = (pCVar10->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,pcVar2,pcVar2 + (pCVar10->file)._M_string_length);
        local_300 = pCVar10->line;
        local_240 = &local_230;
        local_370.file._M_dataplus._M_p = (pointer)0x16;
        local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)std::__cxx11::string::_M_create((ulong *)&local_240,(ulong)&local_370);
        local_230._M_allocated_capacity = (size_type)local_370.file._M_dataplus._M_p;
        local_240->_M_allocated_capacity = 0x6543796669726556;
        *(char *)((long)local_240 + 8) = 'r';
        *(char *)((long)local_240 + 9) = 't';
        *(char *)((long)local_240 + 10) = 'i';
        *(char *)((long)local_240 + 0xb) = 'f';
        *(char *)((long)local_240 + 0xc) = 'i';
        *(char *)((long)local_240 + 0xd) = 'c';
        *(char *)((long)local_240 + 0xe) = 'a';
        *(char *)((long)local_240 + 0xf) = 't';
        *(char *)((long)local_240 + 0xe) = 'a';
        *(char *)((long)local_240 + 0xf) = 't';
        *(char *)((long)local_240 + 0x10) = 'e';
        *(char *)((long)local_240 + 0x11) = 'C';
        *(char *)((long)local_240 + 0x12) = 'h';
        *(char *)((long)local_240 + 0x13) = 'a';
        *(char *)((long)local_240 + 0x14) = 'i';
        *(char *)((long)local_240 + 0x15) = 'n';
        local_238 = local_370.file._M_dataplus._M_p;
        local_240->_M_local_buf[(long)local_370.file._M_dataplus._M_p] = '\0';
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_240);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar20) {
          local_288.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_288.field_2._8_8_ = plVar11[3];
        }
        else {
          local_288.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_288._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_288._M_string_length = plVar11[1];
        *plVar11 = (long)paVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_288);
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar20) {
          local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2f8.field_2._8_8_ = plVar11[3];
        }
        else {
          local_2f8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2f8._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_2f8._M_string_length = plVar11[1];
        *plVar11 = (long)paVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::append((char *)&local_2f8);
        local_398 = &local_388;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar20) {
          local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_388._8_8_ = plVar11[3];
        }
        else {
          local_388._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11;
        }
        local_390 = (pointer)plVar11[1];
        *plVar11 = (long)paVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_398,**(ulong **)local_1f0);
        local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar11 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar11 == paVar20) {
          local_348.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_348.field_2._8_8_ = plVar11[3];
        }
        else {
          local_348.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_348._M_dataplus._M_p = (pointer)*plVar11;
        }
        local_348._M_string_length = plVar11[1];
        *plVar11 = (long)paVar20;
        plVar11[1] = 0;
        *(undefined1 *)(plVar11 + 2) = 0;
        pcVar15 = strchr(pcVar8,0x2c);
        if (pcVar15 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,pcVar8,&local_219)
          ;
        }
        else {
          local_1e8 = &local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,pcVar8,pcVar15);
        }
        local_198._M_dataplus._M_p = (pointer)local_1e8;
        if (local_1e0 != 0) {
          ptVar22 = (type_info *)(local_1e8->_M_local_buf + local_1e0);
          do {
            paVar20 = local_1e8;
            iVar7 = isspace((uint)(byte)ptVar22[-1]);
            local_198._M_dataplus._M_p = (pointer)paVar20;
            if (iVar7 == 0) break;
            paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(ptVar22 + -1);
            uVar18 = (long)paVar19 - (long)paVar20;
            std::__cxx11::string::_M_erase((ulong)&local_1e8,uVar18);
            ptVar22 = (type_info *)(local_1e8->_M_local_buf + uVar18);
            local_198._M_dataplus._M_p = (pointer)local_1e8;
          } while (paVar19 != paVar20);
        }
        local_1e8 = &local_1d8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == local_1e8) {
          local_198.field_2._8_8_ = local_1d8._8_8_;
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        }
        _Var5._M_p = local_198._M_dataplus._M_p;
        local_198.field_2._M_allocated_capacity._1_7_ = local_1d8._M_allocated_capacity._1_7_;
        local_198.field_2._M_local_buf[0] = local_1d8._M_local_buf[0];
        local_198._M_string_length = local_1e0;
        local_1e0 = 0;
        local_1d8._M_local_buf[0] = '\0';
        GetTypeName_abi_cxx11_
                  ((string *)&local_50,
                   (internal *)
                   &bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate::typeinfo,
                   (type_info *)local_1e8->_M_local_buf);
        uVar4 = local_50._M_allocated_capacity;
        local_370.file._M_dataplus._M_p = (pointer)&local_370.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_370,local_320._M_dataplus._M_p,
                   local_320._M_dataplus._M_p + local_320._M_string_length);
        iVar7 = local_300;
        _Var16._M_p = local_320._M_dataplus._M_p;
        local_370.line = local_300;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_324,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var16._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar13 = strlen(_Var16._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var16._M_p,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_324);
        }
        iVar7 = local_300;
        _Var16._M_p = local_320._M_dataplus._M_p;
        bVar6 = IsTrue(true);
        if (!bVar6) {
          GTestLog::GTestLog(&local_324,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var16._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar13 = strlen(_Var16._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var16._M_p,sVar13);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar7);
          GTestLog::~GTestLog(&local_324);
        }
        pTVar14 = (TestFactoryBase *)operator_new(8);
        pTVar14->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006dce80;
        type_names_00 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&TypeIdHelper<bssl::PkitsTest08CertificatePolicies<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                 ::dummy_;
        pCVar10 = &local_370;
        MakeAndRegisterTestInfo
                  (&local_348,_Var5._M_p,(char *)uVar4,(char *)0x0,pCVar10,
                   &TypeIdHelper<bssl::PkitsTest08CertificatePolicies<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.file._M_dataplus._M_p != &local_370.file.field_2) {
          operator_delete(local_370.file._M_dataplus._M_p,
                          local_370.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_allocated_capacity != &local_40) {
          operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,
                          CONCAT71(local_1d8._M_allocated_capacity._1_7_,local_1d8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348._M_dataplus._M_p != &local_348.field_2) {
          operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398,local_388._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
        }
        if (local_240 != &local_230) {
          operator_delete(local_240,(ulong)(local_230._M_allocated_capacity + 1));
        }
        uVar4 = local_320.field_2._M_allocated_capacity;
        paVar20 = &local_320.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p == paVar20) {
          local_388._8_8_ = local_320.field_2._8_8_;
          local_398 = &local_388;
        }
        else {
          local_398 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_320._M_dataplus._M_p;
        }
        local_388._M_allocated_capacity = local_320.field_2._M_allocated_capacity;
        local_390 = (pointer)local_320._M_string_length;
        local_320._M_string_length = 0;
        local_320.field_2._M_allocated_capacity =
             local_320.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_378 = local_300;
        local_320._M_dataplus._M_p = (pointer)paVar20;
        if (local_398 != &local_388) {
          operator_delete(local_398,uVar4 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320._M_dataplus._M_p != &local_320.field_2) {
          operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
        }
        local_370.file._M_dataplus._M_p = (pointer)&local_370.file.field_2;
        paVar20 = &local_2c8;
        if (local_2d8 == paVar20) {
          local_370.file.field_2._8_8_ = local_2c8._8_8_;
        }
        else {
          local_370.file._M_dataplus._M_p = (pointer)local_2d8;
        }
        local_370.file.field_2._M_allocated_capacity = local_2c8._M_allocated_capacity;
        local_370.file._M_string_length = (size_type)local_2d0;
        local_2d0 = (pointer)0x0;
        local_2c8._M_allocated_capacity = local_2c8._M_allocated_capacity & 0xffffffffffffff00;
        local_370.line = local_2b8;
        local_2d8 = paVar20;
        pCVar23 = (CodeLocation *)strchr(pcVar8,0x2c);
        if (pCVar23 == (CodeLocation *)0x0) {
          pCVar23 = (CodeLocation *)0x0;
        }
        else {
          do {
            psVar3 = &pCVar23->file;
            pCVar23 = (CodeLocation *)((long)&(pCVar23->file)._M_dataplus._M_p + 1);
            iVar7 = isspace((uint)*(byte *)((long)&(psVar3->_M_dataplus)._M_p + 1));
          } while (iVar7 != 0);
        }
        TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,_testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,_bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,_testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>_>
        ::Register((char *)&local_370,pCVar23,local_1f0,paVar20->_M_local_buf,(char *)pCVar10,
                   type_names_00);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_370.file._M_dataplus._M_p != &local_370.file.field_2) {
          operator_delete(local_370.file._M_dataplus._M_p,
                          (ulong)(local_370.file.field_2._M_allocated_capacity + 1));
        }
        if ((CodeLocation *)local_70._0_8_ != (CodeLocation *)(local_70 + 0x10)) {
          operator_delete((void *)local_70._0_8_,stack0xffffffffffffffa0 + 1);
        }
        if (local_2d8 != &local_2c8) {
          operator_delete(local_2d8,local_2c8._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if (local_268 != &local_258) {
          operator_delete(local_268,(ulong)(local_258._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        if (local_178 != &local_168) {
          operator_delete(local_178,(ulong)(local_168._M_allocated_capacity + 1));
        }
        paVar20 = &local_c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._16_8_ != paVar20) {
          operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
          paVar20 = extraout_RAX;
        }
        return SUB81(paVar20,0);
      }
      goto LAB_003fbd96;
    }
  }
  FormatFileLocation_abi_cxx11_
            (&local_370.file,(internal *)local_268->_M_local_buf,(char *)(ulong)local_248,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
LAB_003fbd96:
  FormatFileLocation_abi_cxx11_
            (&local_370.file,(internal *)local_2d8->_M_local_buf,(char *)(ulong)local_2b8,iVar7);
  TypeParameterizedTestSuite<bssl::PkitsTest08CertificatePolicies,testing::internal::Templates<bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AllCertificatesSamePoliciesTest13Subpart3,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8AnyPolicyTest14Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest15,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest16,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest17,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart1,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest18Subpart2,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8UserNoticeQualifierTest19,bssl::gtest_suite_PkitsTest08CertificatePolicies_::Section8CPSPointerQualifierTest20>,testing::internal::Types<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,(ulong)(local_348.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_398 != &local_388) {
    operator_delete(local_398,local_388._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,(ulong)(local_2f8.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if (local_240 != &local_230) {
    operator_delete(local_240,local_230._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((CodeLocation *)local_70._0_8_ != (CodeLocation *)(local_70 + 0x10)) {
    operator_delete((void *)local_70._0_8_,(ulong)((local_1c8->file)._M_dataplus._M_p + 1));
  }
  if (local_2d8 != &local_2c8) {
    operator_delete(local_2d8,(ulong)(local_2c8._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,(ulong)(local_258._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,(ulong)(local_168._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._16_8_ != &local_c0) {
    operator_delete((void *)local_e0._16_8_,local_c0._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }